

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::setupMemory(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  bool bVar2;
  Index IVar3;
  reference this_00;
  reference pvVar4;
  pointer pMVar5;
  pointer pDVar6;
  Const *pCVar7;
  address64_t aVar8;
  Name name;
  Name name_00;
  Name memory_00;
  Name memory_01;
  Name NVar9;
  string_view name_;
  value_type local_2cc;
  value_type local_17d;
  uint local_17c;
  ulong uStack_178;
  Index value;
  size_t i_1;
  undefined1 auStack_168 [4];
  Index num;
  char *local_160;
  string_view local_158;
  uintptr_t local_148;
  Literal local_140;
  Address local_128;
  undefined1 local_120 [16];
  Name local_110;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_100;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> segment_1;
  Literal local_f0;
  ulong local_d8;
  size_t j;
  size_t segSize;
  char *local_c0;
  string_view local_b8;
  Address local_a8;
  Name local_a0;
  Name local_90;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_80;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> segment;
  size_t i;
  size_t memCovered;
  size_t numSegments;
  value_type *memory;
  Type local_40;
  bool local_38 [8];
  Address local_30;
  Name local_28;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_18;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory_1;
  TranslateToFuzzReader *this_local;
  
  memory_1._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)this;
  bVar2 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty(&this->wasm->memories);
  if (bVar2) {
    Name::Name(&local_28,"0");
    Address::Address(&local_30,0);
    Address::Address((Address *)local_38,0x10000);
    Type::Type(&local_40,i32);
    NVar9.super_IString.str._M_str = (char *)local_28.super_IString.str._M_len;
    NVar9.super_IString.str._M_len = (size_t)&local_18;
    Builder::makeMemory(NVar9,(Address)local_28.super_IString.str._M_str,local_30,local_38[0],
                        (Type)0x0);
    IVar3 = upTo(this,10);
    pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_18);
    Address::operator=(&pMVar5->initial,(ulong)(IVar3 + 1));
    bVar2 = oneIn(this,2);
    if (bVar2) {
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_18);
      aVar8 = Address::operator_cast_to_unsigned_long(&pMVar5->initial);
      IVar3 = upTo(this,4);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_18);
      Address::operator=(&pMVar5->max,aVar8 + IVar3);
    }
    else {
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_18);
      Address::operator=(&pMVar5->max,0xffffffffffffffff);
    }
    bVar2 = FeatureSet::hasMemory64(&this->wasm->features);
    if ((bVar2) && (bVar2 = oneIn(this,2), bVar2)) {
      Type::Type((Type *)&memory,i64);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (&local_18);
      (pMVar5->addressType).id = (uintptr_t)memory;
    }
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_18);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::operator[](&this->wasm->memories,0);
  bVar2 = FeatureSet::hasBulkMemory(&this->wasm->features);
  if (bVar2) {
    IVar3 = upTo(this,8);
    memCovered = (size_t)IVar3;
    bVar2 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::empty(&this->wasm->dataSegments);
    if ((bVar2) && (memCovered == 0)) {
      memCovered = 1;
    }
    i = 0;
    for (segment._M_t.
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
         super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
              (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>
               )(__uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>)0x0;
        (ulong)segment._M_t.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl < memCovered;
        segment._M_t.
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>
             )((long)segment._M_t.
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 1)) {
      Name::Name(&local_90,"");
      Name::Name(&local_a0,"");
      Address::Address(&local_a8,0);
      name.super_IString.str._M_str = (char *)local_90.super_IString.str._M_len;
      name.super_IString.str._M_len = (size_t)&local_80;
      memory_00.super_IString.str._M_str = (char *)local_a0.super_IString.str._M_len;
      memory_00.super_IString.str._M_len = (size_t)local_90.super_IString.str._M_str;
      Builder::makeDataSegment
                (name,memory_00,SUB81(local_a0.super_IString.str._M_str,0),(Expression *)0x0,
                 (char *)0x0,(Address)0x3dc8ef);
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_80);
      pMVar1 = this->wasm;
      NVar9 = Name::fromInt((size_t)segment._M_t.
                                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)
      ;
      local_c0 = NVar9.super_IString.str._M_str;
      segSize = NVar9.super_IString.str._M_len;
      name_ = (string_view)Names::getValidDataSegmentName(pMVar1,NVar9);
      local_b8 = name_;
      Named::setName(&pDVar6->super_Named,(Name)name_,false);
      IVar3 = upTo(this,2);
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_80);
      pDVar6->isPassive = IVar3 != 0;
      aVar8 = Address::operator_cast_to_unsigned_long
                        (&(this->fuzzParams->super_FuzzParams).USABLE_MEMORY);
      IVar3 = upTo(this,(int)aVar8 * 2);
      j = (size_t)IVar3;
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_80);
      std::vector<char,_std::allocator<char>_>::resize(&pDVar6->data,j);
      for (local_d8 = 0; local_d8 < j; local_d8 = local_d8 + 1) {
        IVar3 = upTo(this,0x200);
        pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(&local_80);
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&pDVar6->data,local_d8);
        *pvVar4 = (value_type)IVar3;
      }
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_80);
      if ((pDVar6->isPassive & 1U) == 0) {
        pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        segment_1._M_t.
        super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
        super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>
             )(pMVar5->addressType).id;
        Literal::makeFromInt32
                  (&local_f0,(int32_t)i,
                   (Type)segment_1._M_t.
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                         .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
        pCVar7 = Builder::makeConst(&this->builder,&local_f0);
        pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(&local_80);
        pDVar6->offset = (Expression *)pCVar7;
        wasm::Literal::~Literal(&local_f0);
        i = i + j;
        pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(&local_80);
        Name::operator=(&pDVar6->memory,(Name *)pMVar5);
      }
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
                (&local_80);
    }
  }
  else {
    bVar2 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::empty(&this->wasm->dataSegments);
    IVar3 = 2;
    if (bVar2) {
      IVar3 = 10;
    }
    bVar2 = oneIn(this,IVar3);
    if (!bVar2) {
      Name::Name(&local_110,"");
      Name::Name((Name *)local_120,"");
      Address::Address(&local_128,0);
      name_00.super_IString.str._M_str = (char *)local_110.super_IString.str._M_len;
      name_00.super_IString.str._M_len = (size_t)&local_100;
      memory_01.super_IString.str._M_str = (char *)local_120._0_8_;
      memory_01.super_IString.str._M_len = (size_t)local_110.super_IString.str._M_str;
      Builder::makeDataSegment
                (name_00,memory_01,(bool)local_120[8],(Expression *)0x0,(char *)0x0,
                 (Address)0x3dc8ef);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_100);
      Name::operator=(&pDVar6->memory,(Name *)pMVar5);
      pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      local_148 = (pMVar5->addressType).id;
      Literal::makeFromInt32(&local_140,0,(Type)local_148);
      pCVar7 = Builder::makeConst(&this->builder,&local_140);
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_100);
      pDVar6->offset = (Expression *)pCVar7;
      wasm::Literal::~Literal(&local_140);
      pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->(&local_100);
      pMVar1 = this->wasm;
      _auStack_168 = (string_view)Name::fromInt(0);
      local_158 = (string_view)Names::getValidDataSegmentName(pMVar1,(Name)_auStack_168);
      Named::setName(&pDVar6->super_Named,(Name)local_158,false);
      aVar8 = Address::operator_cast_to_unsigned_long
                        (&(this->fuzzParams->super_FuzzParams).USABLE_MEMORY);
      i_1._4_4_ = upTo(this,(int)aVar8 * 2);
      for (uStack_178 = 0; uStack_178 < i_1._4_4_; uStack_178 = uStack_178 + 1) {
        local_17c = upTo(this,0x200);
        pDVar6 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->(&local_100);
        if (local_17c < 0x100) {
          local_2cc = (value_type)local_17c;
        }
        else {
          local_2cc = '\0';
        }
        local_17d = local_2cc;
        std::vector<char,_std::allocator<char>_>::push_back(&pDVar6->data,&local_17d);
      }
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
                (&local_100);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupMemory() {
  // Add a memory, if one does not already exist.
  if (wasm.memories.empty()) {
    auto memory = Builder::makeMemory("0");
    // Add at least one page of memory.
    memory->initial = 1 + upTo(10);
    // Make the max potentially higher, or unlimited.
    if (oneIn(2)) {
      memory->max = memory->initial + upTo(4);
    } else {
      memory->max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    if (wasm.features.hasMemory64() && oneIn(2)) {
      memory->addressType = Type::i64;
    }
    wasm.addMemory(std::move(memory));
  }

  auto& memory = wasm.memories[0];
  if (wasm.features.hasBulkMemory()) {
    size_t numSegments = upTo(8);
    // need at least one segment for memory.inits
    if (wasm.dataSegments.empty() && !numSegments) {
      numSegments = 1;
    }
    size_t memCovered = 0;
    for (size_t i = 0; i < numSegments; i++) {
      auto segment = builder.makeDataSegment();
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(i)),
                       false);
      segment->isPassive = bool(upTo(2));
      size_t segSize = upTo(fuzzParams->USABLE_MEMORY * 2);
      segment->data.resize(segSize);
      for (size_t j = 0; j < segSize; j++) {
        segment->data[j] = upTo(512);
      }
      if (!segment->isPassive) {
        segment->offset = builder.makeConst(
          Literal::makeFromInt32(memCovered, memory->addressType));
        memCovered += segSize;
        segment->memory = memory->name;
      }
      wasm.addDataSegment(std::move(segment));
    }
  } else {
    // init some data, especially if none exists before
    if (!oneIn(wasm.dataSegments.empty() ? 10 : 2)) {
      auto segment = builder.makeDataSegment();
      segment->memory = memory->name;
      segment->offset =
        builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(0)),
                       false);
      auto num = upTo(fuzzParams->USABLE_MEMORY * 2);
      for (size_t i = 0; i < num; i++) {
        auto value = upTo(512);
        segment->data.push_back(value >= 256 ? 0 : (value & 0xff));
      }
      wasm.addDataSegment(std::move(segment));
    }
  }
}